

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O2

void __thiscall
OpenMD::EAMAdapter::makeZhou2005Oxygen
          (EAMAdapter *this,RealType re,RealType fe,RealType alpha,RealType beta,RealType A,
          RealType B,RealType kappa,RealType lambda,RealType gamma,RealType nu,
          vector<double,_std::allocator<double>_> *OrhoLimits,
          vector<double,_std::allocator<double>_> *OrhoE,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *OF)

{
  AtomType *pAVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  RealType local_1d8;
  RealType local_1d0;
  RealType local_1c8;
  RealType local_1c0;
  RealType local_1b8;
  RealType local_1b0;
  RealType local_1a8;
  RealType local_1a0;
  shared_ptr<OpenMD::GenericData> local_198;
  shared_ptr<OpenMD::GenericData> local_188;
  undefined4 local_170;
  undefined1 *local_168;
  undefined8 local_160;
  undefined1 local_158 [16];
  RealType local_148;
  ZhouParameters local_140;
  
  local_1f8.field_2._8_8_ = OF;
  local_1d8 = re;
  local_1d0 = fe;
  local_1c8 = alpha;
  local_1c0 = beta;
  local_1b8 = A;
  local_1b0 = B;
  local_1a8 = kappa;
  local_1a0 = lambda;
  bVar2 = isEAM(this);
  if (bVar2) {
    AtomType::removeProperty(this->at_,(string *)EAMtypeID_abi_cxx11_);
    AtomType::removeProperty(this->at_,(string *)ZhouTypeID_abi_cxx11_);
  }
  local_168 = local_158;
  local_160 = 0;
  local_158[0] = 0;
  memset(&local_140.rhoe,0,0x100);
  local_170 = 4;
  local_148 = local_1d8;
  local_140.re = local_1d8;
  local_140.fe = local_1d0;
  local_140.alpha = local_1c8;
  local_140.beta = local_1c0;
  local_140.A = local_1b8;
  local_140.B = local_1b0;
  local_140.kappa = local_1a8;
  local_140.lambda = local_1a0;
  local_140.gamma = gamma;
  local_140.nu = nu;
  std::vector<double,_std::allocator<double>_>::operator=(&local_140.OrhoLimits,OrhoLimits);
  std::vector<double,_std::allocator<double>_>::operator=(&local_140.OrhoE,OrhoE);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&local_140.OF,
              (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_1f8.field_2._8_8_);
  pAVar1 = this->at_;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,std::__cxx11::string_const&,OpenMD::EAMParameters&>
            (&local_1f8,(EAMParameters *)EAMtypeID_abi_cxx11_);
  local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1f8._M_dataplus._M_p;
  local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length;
  local_1f8._M_dataplus._M_p = (pointer)0x0;
  local_1f8._M_string_length = 0;
  AtomType::addProperty(pAVar1,&local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length);
  pAVar1 = this->at_;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>,std::__cxx11::string_const&,OpenMD::ZhouParameters&>
            (&local_1f8,(ZhouParameters *)ZhouTypeID_abi_cxx11_);
  local_198.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1f8._M_dataplus._M_p;
  local_198.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length;
  local_1f8._M_dataplus._M_p = (pointer)0x0;
  local_1f8._M_string_length = 0;
  AtomType::addProperty(pAVar1,&local_198);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_198.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length);
  ZhouParameters::~ZhouParameters(&local_140);
  std::__cxx11::string::~string((string *)&local_168);
  return;
}

Assistant:

void EAMAdapter::makeZhou2005Oxygen(RealType re, RealType fe, RealType alpha,
                                      RealType beta, RealType A, RealType B,
                                      RealType kappa, RealType lambda,
                                      RealType gamma, RealType nu,
                                      std::vector<RealType> OrhoLimits,
                                      std::vector<RealType> OrhoE,
                                      std::vector<std::vector<RealType>> OF) {
    if (isEAM()) {
      at_->removeProperty(EAMtypeID);
      at_->removeProperty(ZhouTypeID);
    }

    EAMParameters eamParam {};
    ZhouParameters zhouParam {};

    eamParam.eamType = eamZhou2005Oxygen;

    eamParam.latticeConstant = re;

    zhouParam.re         = re;
    zhouParam.fe         = fe;
    zhouParam.alpha      = alpha;
    zhouParam.beta       = beta;
    zhouParam.A          = A;
    zhouParam.B          = B;
    zhouParam.kappa      = kappa;
    zhouParam.lambda     = lambda;
    zhouParam.gamma      = gamma;
    zhouParam.nu         = nu;
    zhouParam.OrhoLimits = OrhoLimits;
    zhouParam.OrhoE      = OrhoE;
    zhouParam.OF         = OF;

    at_->addProperty(std::make_shared<EAMData>(EAMtypeID, eamParam));
    at_->addProperty(std::make_shared<ZhouData>(ZhouTypeID, zhouParam));
  }